

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

void __thiscall
Test::Suite::testRun
          (Suite *this,bool success,char *fileName,uint32_t lineNumber,string *errorMessage,
          string *userMessage)

{
  AssertionFailedException *this_00;
  undefined7 in_register_00000031;
  Assertion AStack_d8;
  
  if ((int)CONCAT71(in_register_00000031,success) == 0) {
    Assertion::Assertion(&AStack_d8,fileName,lineNumber,errorMessage,userMessage);
    testFailed(this,&AStack_d8);
    Assertion::~Assertion(&AStack_d8);
    if (this->continueAfterFail == false) {
      this_00 = (AssertionFailedException *)__cxa_allocate_exception(0x10);
      AssertionFailedException::AssertionFailedException(this_00);
      __cxa_throw(this_00,&AssertionFailedException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    Assertion::Assertion(&AStack_d8,fileName,lineNumber);
    testSucceeded(this,&AStack_d8);
    Assertion::~Assertion(&AStack_d8);
  }
  return;
}

Assistant:

void Suite::testRun(
    bool success, const char *fileName, uint32_t lineNumber, std::string &&errorMessage, const std::string &userMessage) {
  if (!success) {
    testFailed(Assertion(fileName, lineNumber, errorMessage, userMessage));
    if (!continueAfterFailure())
      throw AssertionFailedException{};
  } else
    testSucceeded(Assertion(fileName, lineNumber));
}